

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict2pid.c
# Opt level: O0

void dict2pid_dump(FILE *fp,dict2pid_t *d2p)

{
  int iVar1;
  bin_mdef_t *m;
  dict_t *pdVar2;
  s3ssid_t sVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  char *local_58;
  dict_t *dict;
  bin_mdef_t *mdef;
  int32 r;
  int32 l;
  int32 b;
  int32 j;
  int32 i;
  int32 pronlen;
  int32 p;
  int32 w;
  dict2pid_t *d2p_local;
  FILE *fp_local;
  
  m = d2p->mdef;
  pdVar2 = d2p->dict;
  fprintf((FILE *)fp,"# INTERNAL (wd comssid ssid ssid ... ssid comssid)\n");
  for (pronlen = 0; pronlen < pdVar2->n_word; pronlen = pronlen + 1) {
    if (pronlen < 0) {
      local_58 = (char *)0x0;
    }
    else {
      local_58 = pdVar2->word[pronlen].word;
    }
    fprintf((FILE *)fp,"%30s ",local_58);
    iVar1 = pdVar2->word[pronlen].pronlen;
    for (i = 0; i < iVar1; i = i + 1) {
      sVar3 = dict2pid_internal(d2p,pronlen,i);
      fprintf((FILE *)fp," %5d",(ulong)sVar3);
    }
    fprintf((FILE *)fp,"\n");
  }
  fprintf((FILE *)fp,"#\n");
  fprintf((FILE *)fp,"# LDIPH_LC (b r l ssid)\n");
  for (r = 0; r < m->n_ciphone; r = r + 1) {
    for (mdef._0_4_ = 0; (int)mdef < m->n_ciphone; mdef._0_4_ = (int)mdef + 1) {
      for (mdef._4_4_ = 0; mdef._4_4_ < m->n_ciphone; mdef._4_4_ = mdef._4_4_ + 1) {
        if (d2p->ldiph_lc[r][(int)mdef][mdef._4_4_] != 0xffff) {
          pcVar4 = bin_mdef_ciphone_str(m,(int)(short)r);
          pcVar5 = bin_mdef_ciphone_str(m,(int)(short)(int)mdef);
          pcVar6 = bin_mdef_ciphone_str(m,(int)(short)mdef._4_4_);
          fprintf((FILE *)fp,"%6s %6s %6s %5d\n",pcVar4,pcVar5,pcVar6,
                  (ulong)d2p->ldiph_lc[r][(int)mdef][mdef._4_4_]);
        }
      }
    }
  }
  fprintf((FILE *)fp,"#\n");
  fprintf((FILE *)fp,"# SSEQ %d (senid senid ...)\n",(ulong)(uint)m->n_sseq);
  for (b = 0; b < m->n_sseq; b = b + 1) {
    fprintf((FILE *)fp,"%5d ",(ulong)(uint)b);
    for (l = 0; l < m->n_emit_state; l = l + 1) {
      fprintf((FILE *)fp," %5d",(ulong)m->sseq[b][l]);
    }
    fprintf((FILE *)fp,"\n");
  }
  fprintf((FILE *)fp,"#\n");
  fprintf((FILE *)fp,"# END\n");
  fflush((FILE *)fp);
  return;
}

Assistant:

void
dict2pid_dump(FILE * fp, dict2pid_t * d2p)
{
    int32 w, p, pronlen;
    int32 i, j, b, l, r;
    bin_mdef_t *mdef = d2p->mdef;
    dict_t *dict = d2p->dict;

    fprintf(fp, "# INTERNAL (wd comssid ssid ssid ... ssid comssid)\n");
    for (w = 0; w < dict_size(dict); w++) {
        fprintf(fp, "%30s ", dict_wordstr(dict, w));

        pronlen = dict_pronlen(dict, w);
        for (p = 0; p < pronlen; p++)
            fprintf(fp, " %5d", dict2pid_internal(d2p, w, p));
        fprintf(fp, "\n");
    }
    fprintf(fp, "#\n");

    fprintf(fp, "# LDIPH_LC (b r l ssid)\n");
    for (b = 0; b < bin_mdef_n_ciphone(mdef); b++) {
        for (r = 0; r < bin_mdef_n_ciphone(mdef); r++) {
            for (l = 0; l < bin_mdef_n_ciphone(mdef); l++) {
                if (IS_S3SSID(d2p->ldiph_lc[b][r][l]))
                    fprintf(fp, "%6s %6s %6s %5d\n", bin_mdef_ciphone_str(mdef, (s3cipid_t) b), bin_mdef_ciphone_str(mdef, (s3cipid_t) r), bin_mdef_ciphone_str(mdef, (s3cipid_t) l), d2p->ldiph_lc[b][r][l]);      /* RAH, ldiph_lc is returning an int32, %d expects an int16 */
            }
        }
    }
    fprintf(fp, "#\n");

    fprintf(fp, "# SSEQ %d (senid senid ...)\n", mdef->n_sseq);
    for (i = 0; i < mdef->n_sseq; i++) {
        fprintf(fp, "%5d ", i);
        for (j = 0; j < bin_mdef_n_emit_state(mdef); j++)
            fprintf(fp, " %5d", mdef->sseq[i][j]);
        fprintf(fp, "\n");
    }
    fprintf(fp, "#\n");
    fprintf(fp, "# END\n");

    fflush(fp);
}